

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_buf_slot_setup(MppBufSlots slots,RK_S32 count)

{
  MPP_RET MVar1;
  void *pvVar2;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_setup");
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)buf_slot_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_buf_slot","slot %p setup: count %d\n",(char *)0x0,slots,count);
    }
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    if (*(void **)((long)slots + 0xe8) == (void *)0x0) {
      *(RK_S32 *)((long)slots + 0x20) = count;
      *(RK_S32 *)((long)slots + 0x60) = count;
      pvVar2 = mpp_osal_calloc("mpp_buf_slot_setup",(long)count * 0x38);
      *(void **)((long)slots + 0xe8) = pvVar2;
      init_slot_entry((MppBufSlotsImpl *)slots,0,count);
      *(undefined4 *)((long)slots + 100) = 0;
    }
    else {
      if (*(int *)((long)slots + 0x60) < count) {
        pvVar2 = mpp_osal_realloc("mpp_buf_slot_setup",*(void **)((long)slots + 0xe8),
                                  (long)count * 0x38);
        *(void **)((long)slots + 0xe8) = pvVar2;
        if (pvVar2 == (void *)0x0) {
          _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                     "mpp_buf_slot_setup",0x394);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
            abort();
          }
        }
        init_slot_entry((MppBufSlotsImpl *)slots,*(int *)((long)slots + 0x60),
                        count - *(int *)((long)slots + 0x60));
      }
      *(RK_S32 *)((long)slots + 0x20) = count;
    }
    Mutex::Autolock::~Autolock(&auto_lock);
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buf_slot_setup(MppBufSlots slots, RK_S32 count)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    buf_slot_dbg(BUF_SLOT_DBG_SETUP, "slot %p setup: count %d\n", slots, count);

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);

    if (NULL == impl->slots) {
        // first slot setup
        impl->buf_count = impl->new_count = count;
        impl->slots = mpp_calloc(MppBufSlotEntry, count);
        init_slot_entry(impl, 0, count);
        impl->used_count = 0;
    } else {
        // record the slot count for info changed ready config
        if (count > impl->buf_count) {
            impl->slots = mpp_realloc(impl->slots, MppBufSlotEntry, count);
            mpp_assert(impl->slots);
            init_slot_entry(impl, impl->buf_count, (count - impl->buf_count));
        }
        impl->new_count = count;
    }

    return MPP_OK;
}